

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_ptr_tests.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_712d::StatePointer_CopyConstructor_Test::TestBody
          (StatePointer_CopyConstructor_Test *this)

{
  bool bVar1;
  char *message;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> local_50;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p1;
  state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL> p2;
  undefined1 local_38 [4];
  Foo foo;
  AssertionResult gtest_ar;
  AssertHelper local_20;
  
  putl::state_ptr<(anonymous_namespace)::Foo,_unsigned_long,_2UL>::state_ptr
            (&local_50,(pointer_type)((long)&p2.m_ptr_and_state + 4),1);
  p1.m_ptr_and_state = local_50.m_ptr_and_state;
  testing::internal::EqHelper<false>::
  Compare<putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>,putl::state_ptr<(anonymous_namespace)::Foo,unsigned_long,2ul>>
            ((EqHelper<false> *)local_38,"p1","p2",&local_50,&p1);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    testing::Message::Message((Message *)&gtest_ar.message_);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_38);
    testing::internal::AssertHelper::AssertHelper
              (&local_20,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Robbepop[P]state_ptr/testsrc/state_ptr_tests.cpp"
               ,0x46,message);
    testing::internal::AssertHelper::operator=(&local_20,(Message *)&gtest_ar.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_20);
    testing::Message::~Message((Message *)&gtest_ar.message_);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  return;
}

Assistant:

TEST(StatePointer, CopyConstructor) {
	Foo foo;
	state_ptr<Foo> p1{&foo, 1};
	state_ptr<Foo> p2{p1};
	ASSERT_EQ(p1, p2);
}